

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_json_check(JSContext *ctx,JSONStringifyContext *jsc,JSValue holder,JSValue val,
                     JSValue key)

{
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue v_03;
  JSValue v_04;
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue func_obj;
  JSValue v_05;
  JSValue v_06;
  JSValue val_00;
  JSValue JVar1;
  int iVar2;
  JSValue *in_RSI;
  JSContext *in_RDI;
  JSValueUnion in_R8;
  undefined8 in_R9;
  JSValue JVar3;
  JSValue JVar4;
  JSValue f;
  JSValue args [2];
  JSValue v;
  JSContext *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  uint uVar5;
  JSValue *pJVar6;
  JSValueUnion local_d8;
  undefined1 in_stack_ffffffffffffff38 [16];
  undefined1 auVar7 [12];
  JSValueUnion in_stack_ffffffffffffff48;
  int64_t in_stack_ffffffffffffff50;
  JSValueUnion in_stack_ffffffffffffff58;
  int64_t in_stack_ffffffffffffff60;
  JSValueUnion in_stack_ffffffffffffff80;
  JSValueUnion local_60;
  uint local_58;
  undefined4 uStack_54;
  int32_t local_40;
  undefined4 uStack_3c;
  int64_t local_38;
  JSValueUnion local_10;
  int64_t local_8;
  
  auVar7 = in_stack_ffffffffffffff38._4_12_;
  pJVar6 = (JSValue *)&stack0x00000008;
  local_58 = (uint)in_R9;
  uStack_54 = (undefined4)((ulong)in_R9 >> 0x20);
  JVar3.tag._0_4_ = local_58;
  JVar3.u.float64 = in_R8.float64;
  JVar3.tag._4_4_ = uStack_54;
  iVar2 = JS_IsObject(JVar3);
  local_60 = in_R8;
  if (iVar2 != 0) {
    JVar3 = JS_GetPropertyInternal
                      ((JSContext *)args[1].u.ptr,v,args[0].tag._4_4_,(JSValue)stack0x00000068,
                       key.u.int32);
    local_10 = JVar3.u;
    local_8 = JVar3.tag;
    iVar2 = JS_IsException(JVar3);
    if (iVar2 == 0) {
      JVar4.tag = local_8;
      JVar4.u.ptr = local_10.ptr;
      iVar2 = JS_IsFunction(in_RDI,JVar4);
      if (iVar2 == 0) {
        v_01.u._4_4_ = in_stack_ffffffffffffff1c;
        v_01.u.int32 = in_stack_ffffffffffffff18;
        v_01.tag = (int64_t)pJVar6;
        JS_FreeValue(in_stack_ffffffffffffff10,v_01);
        in_stack_ffffffffffffff48 = local_10;
        in_stack_ffffffffffffff50 = local_8;
      }
      else {
        func_obj.tag = in_stack_ffffffffffffff60;
        func_obj.u.float64 = in_stack_ffffffffffffff58.float64;
        this_obj.tag = local_8;
        this_obj.u.ptr = local_10.ptr;
        JVar4 = JS_CallFree(auVar7._4_8_,func_obj,this_obj,auVar7._0_4_,
                            (JSValue *)in_stack_ffffffffffffff80.ptr);
        local_60 = JVar4.u;
        v_00.u._4_4_ = in_stack_ffffffffffffff1c;
        v_00.u.int32 = in_stack_ffffffffffffff18;
        v_00.tag = (int64_t)pJVar6;
        JVar3 = JVar4;
        JS_FreeValue(in_stack_ffffffffffffff10,v_00);
        auVar7 = JVar3._4_12_;
        local_58 = (uint)JVar4.tag;
        uStack_54 = JVar4.tag._4_4_;
        v_05.tag._0_4_ = local_58;
        v_05.u.float64 = local_60.float64;
        v_05.tag._4_4_ = uStack_54;
        in_stack_ffffffffffffff80 = local_60;
        iVar2 = JS_IsException(v_05);
        in_stack_ffffffffffffff48 = local_10;
        in_stack_ffffffffffffff50 = local_8;
        if (iVar2 != 0) goto LAB_00149678;
      }
      goto LAB_001494be;
    }
LAB_00149678:
    v_04.u._4_4_ = in_stack_ffffffffffffff1c;
    v_04.u.int32 = in_stack_ffffffffffffff18;
    v_04.tag = (int64_t)pJVar6;
    JS_FreeValue(in_stack_ffffffffffffff10,v_04);
    local_40 = 0;
    local_38 = 6;
    goto LAB_001496ac;
  }
LAB_001494be:
  iVar2 = JS_IsUndefined(*in_RSI);
  if (iVar2 == 0) {
    this_obj_00.tag = in_stack_ffffffffffffff50;
    this_obj_00.u.float64 = in_stack_ffffffffffffff48.float64;
    JVar3 = JS_Call(auVar7._4_8_,*pJVar6,this_obj_00,auVar7._0_4_,
                    (JSValue *)in_stack_ffffffffffffff80.ptr);
    local_d8 = JVar3.u;
    v_02.u._4_4_ = in_stack_ffffffffffffff1c;
    v_02.u.int32 = in_stack_ffffffffffffff18;
    v_02.tag = (int64_t)pJVar6;
    JS_FreeValue(in_stack_ffffffffffffff10,v_02);
    local_58 = (uint)JVar3.tag;
    uStack_54 = JVar3.tag._4_4_;
    v_06.tag._0_4_ = local_58;
    v_06.u.float64 = local_d8.float64;
    v_06.tag._4_4_ = uStack_54;
    iVar2 = JS_IsException(v_06);
    local_60 = local_d8;
    if (iVar2 != 0) goto LAB_00149678;
  }
  if (local_58 == 0xfffffff9) {
LAB_0014961e:
    local_40 = local_60.int32;
    uStack_3c = local_60._4_4_;
    local_38 = CONCAT44(uStack_54,local_58);
  }
  else {
    uVar5 = local_58;
    if (local_58 == 0xffffffff) {
      val_00.tag._0_4_ = 0xffffffff;
      val_00.u.float64 = local_60.float64;
      val_00.tag._4_4_ = uStack_54;
      iVar2 = JS_IsFunction(in_RDI,val_00);
      if (iVar2 == 0) goto LAB_0014961e;
    }
    else if ((local_58 < 3) || (local_58 - 6 < 2)) goto LAB_0014961e;
    v_03.u._4_4_ = uVar5;
    v_03.u.int32 = in_stack_ffffffffffffff18;
    v_03.tag = (int64_t)pJVar6;
    JS_FreeValue(in_stack_ffffffffffffff10,v_03);
    local_40 = 0;
    local_38 = 3;
  }
LAB_001496ac:
  JVar1.u._4_4_ = uStack_3c;
  JVar1.u.int32 = local_40;
  JVar1.tag = local_38;
  return JVar1;
}

Assistant:

static JSValue js_json_check(JSContext *ctx, JSONStringifyContext *jsc,
                             JSValueConst holder, JSValue val, JSValueConst key)
{
    JSValue v;
    JSValueConst args[2];

    if (JS_IsObject(val)
#ifdef CONFIG_BIGNUM
    ||  JS_IsBigInt(ctx, val)   /* XXX: probably useless */
#endif
        ) {
            JSValue f = JS_GetProperty(ctx, val, JS_ATOM_toJSON);
            if (JS_IsException(f))
                goto exception;
            if (JS_IsFunction(ctx, f)) {
                v = JS_CallFree(ctx, f, val, 1, &key);
                JS_FreeValue(ctx, val);
                val = v;
                if (JS_IsException(val))
                    goto exception;
            } else {
                JS_FreeValue(ctx, f);
            }
        }

    if (!JS_IsUndefined(jsc->replacer_func)) {
        args[0] = key;
        args[1] = val;
        v = JS_Call(ctx, jsc->replacer_func, holder, 2, args);
        JS_FreeValue(ctx, val);
        val = v;
        if (JS_IsException(val))
            goto exception;
    }

    switch (JS_VALUE_GET_NORM_TAG(val)) {
    case JS_TAG_OBJECT:
        if (JS_IsFunction(ctx, val))
            break;
    case JS_TAG_STRING:
    case JS_TAG_INT:
    case JS_TAG_FLOAT64:
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_FLOAT:
#endif
    case JS_TAG_BOOL:
    case JS_TAG_NULL:
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_INT:
#endif
    case JS_TAG_EXCEPTION:
        return val;
    default:
        break;
    }
    JS_FreeValue(ctx, val);
    return JS_UNDEFINED;

exception:
    JS_FreeValue(ctx, val);
    return JS_EXCEPTION;
}